

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_newc.c
# Opt level: O2

uint32_t from_hex(char *p,size_t l)

{
  char cVar1;
  uint32_t uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (lVar3 == 8) {
      return uVar2;
    }
    cVar1 = p[lVar3];
    if ((byte)(cVar1 + 0x9fU) < 6) {
      bVar4 = cVar1 + 0xa9;
LAB_001098bf:
      uVar5 = (uint)bVar4;
    }
    else {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar4 = cVar1 - 0x37;
        goto LAB_001098bf;
      }
      uVar5 = (int)cVar1 - 0x30;
    }
    uVar2 = uVar2 * 0x10 + uVar5;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static uint32_t
from_hex(const char *p, size_t l)
{
	uint32_t r = 0;

	while (l > 0) {
		r *= 16;
		if (*p >= 'a' && *p <= 'f')
			r += *p + 10 - 'a';
		else if (*p >= 'A' && *p <= 'F')
			r += *p + 10 - 'A';
		else
			r += *p - '0';
		--l;
		++p;
	}
	return (r);
}